

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  _Rb_tree_node_base *__k;
  Mode MVar1;
  char *pcVar2;
  bool bVar3;
  ParseArgumentStatus PVar4;
  ostream *poVar5;
  iterator iVar6;
  long *plVar7;
  _Base_ptr extraout_RAX;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  ulong *puVar11;
  CommandLineInterface *pCVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  CommandLineInterface *pCVar16;
  ulong unaff_RBP;
  char *pcVar17;
  int iVar18;
  pointer directive;
  bool bVar19;
  bool bVar20;
  string value;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string local_100;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  CommandLineInterface *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  ulong local_78;
  _Base_ptr local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  _Rb_tree_node_base *local_60;
  string *local_58;
  _Base_ptr local_50 [2];
  long local_40;
  
  pcVar17 = *argv;
  pcVar2 = (char *)(this->executable_name_)._M_string_length;
  strlen(pcVar17);
  local_a0 = this;
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar17);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < argc) {
    unaff_RBP = 1;
    do {
      std::__cxx11::string::string((string *)local_e0,argv[unaff_RBP],(allocator *)&local_100);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
      this = (CommandLineInterface *)local_e0._0_8_;
      if ((CommandLineInterface *)local_e0._0_8_ != (CommandLineInterface *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      unaff_RBP = unaff_RBP + 1;
    } while ((uint)argc != unaff_RBP);
  }
  PVar4 = (ParseArgumentStatus)unaff_RBP;
  bVar19 = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar19) {
    uVar10 = 0;
    iVar18 = 0;
    do {
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = (_Base_ptr)0x0;
      local_e0._16_8_ = local_e0._16_8_ & 0xffffffffffffff00;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_allocated_capacity =
           local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = ParseArgument(this,local_98.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,
                            (string *)local_e0,&local_100);
      if (bVar3) {
        iVar15 = iVar18 + 1;
        if (((long)local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5 != (long)iVar15) &&
           (*local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar15]._M_dataplus._M_p != '-')) {
          std::__cxx11::string::_M_assign((string *)&local_100);
          iVar18 = iVar15;
          goto LAB_00205b59;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Missing value for flag: ",0x18);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_e0._0_8_,local_e0._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        iVar15 = std::__cxx11::string::compare((char *)local_e0);
        unaff_RBP = 2;
        if (iVar15 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"To decode an unknown message, use --decode_raw.",0x2f);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        bVar3 = false;
      }
      else {
LAB_00205b59:
        PVar4 = InterpretArgument(local_a0,(string *)local_e0,&local_100);
        bVar3 = PVar4 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
        unaff_RBP = unaff_RBP & 0xffffffff;
        if (!bVar3) {
          unaff_RBP = (ulong)PVar4;
        }
      }
      PVar4 = (ParseArgumentStatus)unaff_RBP;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      this = (CommandLineInterface *)local_e0._0_8_;
      if ((CommandLineInterface *)local_e0._0_8_ != (CommandLineInterface *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      if (!bVar3) break;
      iVar18 = iVar18 + 1;
      uVar10 = (ulong)iVar18;
      uVar13 = (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar19 = uVar10 < uVar13;
    } while (uVar10 < uVar13);
  }
  if (bVar19) goto LAB_00206020;
  p_Var9 = *(_Base_ptr *)
            ((long)&(local_a0->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header +
            0x10);
  local_60 = &(local_a0->plugin_parameters_)._M_t._M_impl.super__Rb_tree_header._M_header;
  pCVar16 = local_a0;
  if (p_Var9 != local_60) {
    local_68 = &local_a0->plugins_;
    local_70 = &(local_a0->plugins_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = &local_a0->plugin_prefix_;
    local_78 = 0;
    do {
      __k = p_Var9 + 1;
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_68->_M_t,(key_type *)__k);
      if (iVar6._M_node == local_70) {
        directive = (pCVar16->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (directive !=
            (pCVar16->output_directives_).
            super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar3 = false;
          bVar19 = false;
          do {
            if (directive->generator == (CodeGenerator *)0x0) {
              anon_unknown_0::PluginName((string *)local_e0,local_58,&directive->name);
              if ((_Base_ptr)local_e0._8_8_ == p_Var9[1]._M_parent) {
                if ((_Base_ptr)local_e0._8_8_ == (_Base_ptr)0x0) {
                  bVar20 = true;
                }
                else {
                  iVar18 = bcmp((void *)local_e0._0_8_,*(void **)__k,local_e0._8_8_);
                  bVar20 = iVar18 == 0;
                }
              }
              else {
                bVar20 = false;
              }
              bVar19 = bVar3;
              if (bVar20) {
                bVar19 = true;
              }
              if ((CommandLineInterface *)local_e0._0_8_ !=
                  (CommandLineInterface *)(local_e0 + 0x10)) {
                operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
              }
              pCVar16 = local_a0;
              bVar3 = bVar19;
              if (bVar20) break;
            }
            directive = directive + 1;
          } while (directive !=
                   (pCVar16->output_directives_).
                   super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar19) goto LAB_00205ec6;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown flag: ",0xe);
        std::__cxx11::string::substr((ulong)local_50,(ulong)__k);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x35297c);
        puVar11 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_100.field_2._M_allocated_capacity = *puVar11;
          local_100.field_2._8_8_ = plVar7[3];
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = *puVar11;
          local_100._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_100._M_string_length = plVar7[1];
        *plVar7 = (long)puVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_e0._0_8_ = local_e0 + 0x10;
        pCVar12 = (CommandLineInterface *)(plVar7 + 2);
        if ((CommandLineInterface *)*plVar7 == pCVar12) {
          local_e0._16_8_ = (pCVar12->executable_name_)._M_dataplus._M_p;
          local_e0._24_8_ = plVar7[3];
        }
        else {
          local_e0._16_8_ = (pCVar12->executable_name_)._M_dataplus._M_p;
          local_e0._0_8_ = (CommandLineInterface *)*plVar7;
        }
        local_e0._8_8_ = plVar7[1];
        *plVar7 = (long)pCVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_e0._0_8_,local_e0._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((CommandLineInterface *)local_e0._0_8_ != (CommandLineInterface *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)&local_40;
        if (local_50[0] != p_Var8) {
          operator_delete(local_50[0],local_40 + 1);
          p_Var8 = extraout_RAX;
        }
        local_78 = CONCAT71((int7)((ulong)p_Var8 >> 8),1);
      }
LAB_00205ec6:
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_60);
    PVar4 = PARSE_ARGUMENT_FAIL;
    if ((local_78 & 1) != 0) goto LAB_00206020;
  }
  if ((pCVar16->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pCVar16->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e0,(char (*) [1])0x357dff,(char (*) [2])0x360593);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&pCVar16->proto_path_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    if ((CommandLineInterface *)local_e0._0_8_ != (CommandLineInterface *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
  }
  MVar1 = pCVar16->mode_;
  bVar19 = (pCVar16->codec_type_)._M_string_length != 0;
  if (bVar19 || MVar1 != MODE_DECODE) {
LAB_00205fa1:
    if ((pCVar16->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pCVar16->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00205fb1:
      if (MVar1 == MODE_COMPILE) {
        if (((pCVar16->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pCVar16->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((pCVar16->descriptor_set_name_)._M_string_length != 0)) goto LAB_0020606e;
        lVar14 = 0x1a;
        pcVar17 = "Missing output directives.";
      }
      else {
        if ((pCVar16->dependency_out_name_)._M_string_length != 0) {
          lVar14 = 0x38;
          pcVar17 = "Can only use --dependency_out=FILE when generating code.";
          goto LAB_00205fe1;
        }
LAB_0020606e:
        if (((pCVar16->dependency_out_name_)._M_string_length == 0) ||
           ((ulong)((long)(pCVar16->input_files_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar16->input_files_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21)) {
          if ((pCVar16->imports_in_descriptor_set_ == true) &&
             ((pCVar16->descriptor_set_name_)._M_string_length == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "--include_imports only makes sense when combined with --descriptor_set_out."
                       ,0x4b);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          PVar4 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
          if ((pCVar16->source_info_in_descriptor_set_ == true) &&
             ((pCVar16->descriptor_set_name_)._M_string_length == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "--include_source_info only makes sense when combined with --descriptor_set_out."
                       ,0x4f);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          goto LAB_00206020;
        }
        lVar14 = 0x41;
        pcVar17 = "Can only process one input file when using --dependency_out=FILE.";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,lVar14);
      PVar4 = PARSE_ARGUMENT_FAIL;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      goto LAB_00206020;
    }
    lVar14 = 0x13;
    pcVar17 = "Missing input file.";
  }
  else {
    if ((pCVar16->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar16->input_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (bVar19 || MVar1 != MODE_DECODE) goto LAB_00205fa1;
      goto LAB_00205fb1;
    }
    lVar14 = 0x38;
    pcVar17 = "When using --decode_raw, no input files should be given.";
  }
LAB_00205fe1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,lVar14);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
  std::ostream::put(-0x50);
  PVar4 = PARSE_ARGUMENT_FAIL;
  std::ostream::flush();
LAB_00206020:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return PVar4;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<string> arguments;
  for (int i = 1; i < argc; ++i) {
    arguments.push_back(argv[i]);
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<string, string>::const_iterator i = plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j = output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        string plugin_name = PluginName(plugin_prefix_ , j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    std::cerr << "When using --decode_raw, no input files should be given."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out." << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}